

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-powerpc.cpp
# Opt level: O1

void __thiscall
powerpc_test_cpu::test_instruction_RRRII(powerpc_test_cpu *this,char *insn,uint32_t opcode)

{
  uint uVar1;
  uint32_t a1;
  long lVar2;
  long lVar3;
  long lVar4;
  int j;
  uint32_t a2;
  
  if (test_instruction_RRRII(char_const*,unsigned_int)::code == '\0') {
    test_instruction_RRRII();
  }
  lVar4 = 0;
  do {
    uVar1 = msk_values[lVar4];
    lVar3 = 0;
    do {
      test_instruction_RRRII::code[0] =
           ((uVar1 & 0x1f) << 6 | opcode & 0xfffff801) + (msk_values[lVar3] & 0x1f) * 2;
      test_instruction_RRRII::code[3] = test_instruction_RRRII::code[0] & 0xffe0ffff;
      lVar2 = 0;
      do {
        a1 = reg_values[lVar2];
        a2 = 0xffffffff;
        do {
          test_one(this,test_instruction_RRRII::code,insn,a1,a2,0,0);
          test_one(this,test_instruction_RRRII::code + 2,insn,a1,a2,0,0);
          a2 = a2 + 1;
        } while (a2 != 0x22);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x24);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  return;
}

Assistant:

void powerpc_test_cpu::test_instruction_RRRII(const char *insn, uint32_t opcode)
{
	// Test code
	static uint32_t code[] = {
		POWERPC_ILLEGAL, POWERPC_BLR,
		POWERPC_MR(0, RA), POWERPC_ILLEGAL, POWERPC_BLR
	};

	// Input values
	const int n_reg_values = sizeof(reg_values)/sizeof(reg_values[0]);
	const int n_msk_values = sizeof(msk_values)/sizeof(msk_values[0]);

	for (int i_mb = 0; i_mb < n_msk_values; i_mb++) {
		const uint32_t mb = msk_values[i_mb];
		for (int i_me = 0; i_me < n_msk_values; i_me++) {
			const uint32_t me = msk_values[i_me];
			MB_field::insert(opcode, mb);
			ME_field::insert(opcode, me);
			code[0] = opcode;
			code[3] = opcode;
			rA_field::insert(code[3], 0);
			flush_icache_range(code, sizeof(code));
			for (int i = 0; i < n_reg_values; i++) {
				const uint32_t ra = reg_values[i];
				for (int j = -1; j <= 33; j++) {
					const uint32_t rb = j;
					test_one(&code[0], insn, ra, rb, 0, 0);
					test_one(&code[2], insn, ra, rb, 0, 0);
				}
			}
		}
	}
}